

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Totals * Catch::runTests(Totals *__return_storage_ptr__,Ptr<Catch::Config> *config)

{
  pointer pPVar1;
  pointer pFVar2;
  Ptr<Catch::IStreamingReporter> PVar3;
  Ptr<const_Catch::IConfig> PVar4;
  pointer pFVar5;
  size_t sVar6;
  int iVar7;
  undefined4 extraout_var;
  TestSpecParser *this;
  IRegistryHub *pIVar8;
  undefined4 extraout_var_00;
  long *plVar9;
  pointer pPVar10;
  TestCase *testCase;
  Ptr<Catch::IStreamingReporter> reporter;
  Ptr<const_Catch::IConfig> iconfig;
  TestSpec testSpec;
  RunContext context;
  Ptr<Catch::IStreamingReporter> local_368;
  Ptr<const_Catch::IConfig> local_360;
  Totals *local_358;
  Ptr<Catch::IStreamingReporter> local_350;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_348;
  TestCase *local_330;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [32];
  size_type local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_2d0;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [16];
  TagAliasRegistry *local_290;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_280;
  string local_268;
  RunContext local_248;
  
  local_360.m_p = (IConfig *)config->m_p;
  local_358 = __return_storage_ptr__;
  if ((Config *)local_360.m_p != (Config *)0x0) {
    (*(((Config *)local_360.m_p)->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.
      super_NonCopyable._vptr_NonCopyable[2])();
  }
  makeReporter((Catch *)&local_368,config);
  local_350.m_p = local_368.m_p;
  if (local_368.m_p != (IStreamingReporter *)0x0) {
    (*((local_368.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[2])();
  }
  addListeners((Catch *)&local_248,&local_360,&local_350);
  if ((IStreamingReporter *)local_248.super_IResultCapture._vptr_IResultCapture !=
      (IStreamingReporter *)0x0) {
    (**(code **)((long)*local_248.super_IResultCapture._vptr_IResultCapture + 0x10))
              (local_248.super_IResultCapture._vptr_IResultCapture);
  }
  PVar3.m_p = local_368.m_p;
  local_368.m_p = (IStreamingReporter *)local_248.super_IResultCapture._vptr_IResultCapture;
  if (PVar3.m_p != (IStreamingReporter *)0x0) {
    (*((PVar3.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
  }
  if ((IStreamingReporter *)local_248.super_IResultCapture._vptr_IResultCapture !=
      (IStreamingReporter *)0x0) {
    (**(code **)((long)*local_248.super_IResultCapture._vptr_IResultCapture + 0x18))
              (local_248.super_IResultCapture._vptr_IResultCapture);
  }
  if (local_350.m_p != (IStreamingReporter *)0x0) {
    (*((local_350.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
  }
  RunContext::RunContext(&local_248,&local_360,&local_368);
  (local_358->testCases).failed = 0;
  (local_358->testCases).failedButOk = 0;
  *(undefined1 (*) [16])&(local_358->assertions).failedButOk = (undefined1  [16])0x0;
  (local_358->assertions).passed = 0;
  (local_358->assertions).failed = 0;
  (*(config->m_p->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.super_NonCopyable.
    _vptr_NonCopyable[6])(local_2f8);
  RunContext::testGroupStarting(&local_248,(string *)local_2f8,1,1);
  if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
    operator_delete((void *)local_2f8._0_8_);
  }
  iVar7 = (*(config->m_p->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.
            super_NonCopyable._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            (&local_348,
             (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             CONCAT44(extraout_var,iVar7));
  if (local_348.
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_348.
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    TagAliasRegistry::get();
    local_2d8 = 0;
    aStack_2d0._M_local_buf[0] = '\0';
    local_2c0 = (undefined1  [16])0x0;
    local_2b0 = (undefined1  [16])0x0;
    local_2a0 = (undefined1  [16])0x0;
    local_290 = &TagAliasRegistry::get::instance;
    local_2f8._24_8_ = &aStack_2d0;
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"~[.]","");
    this = TestSpecParser::parse((TestSpecParser *)local_2f8,&local_268);
    TestSpecParser::addFilter(this);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
              (&local_280,&(this->m_testSpec).m_filters);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::operator=
              (&local_348,&local_280);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p);
    }
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               (local_2b0 + 8));
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::~vector((vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
               *)local_2c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._24_8_ != &aStack_2d0) {
      operator_delete((void *)local_2f8._24_8_);
    }
  }
  PVar4.m_p = local_360.m_p;
  pIVar8 = getRegistryHub();
  iVar7 = (*pIVar8->_vptr_IRegistryHub[3])(pIVar8);
  plVar9 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar7) + 0x18))
                             ((long *)CONCAT44(extraout_var_00,iVar7),PVar4.m_p);
  testCase = (TestCase *)*plVar9;
  local_330 = (TestCase *)plVar9[1];
  if (testCase != local_330) {
    local_308 = (undefined1  [16])0x0;
    local_318 = (undefined1  [16])0x0;
    local_328 = (undefined1  [16])0x0;
    do {
      sVar6 = local_248.m_totals.assertions.failed;
      iVar7 = (*((local_248.m_config.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[10])()
      ;
      pFVar5 = local_348.
               super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      PVar4.m_p = local_360.m_p;
      pFVar2 = local_348.
               super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (sVar6 != (long)iVar7) {
        for (; pFVar2 != pFVar5; pFVar2 = pFVar2 + 1) {
          pPVar10 = (pFVar2->m_patterns).
                    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pPVar1 = (pFVar2->m_patterns).
                   super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          while( true ) {
            if (pPVar10 == pPVar1) {
              iVar7 = (*(((SharedImpl<Catch::IConfig> *)&(PVar4.m_p)->super_IShared)->super_IConfig)
                        .super_IShared.super_NonCopyable._vptr_NonCopyable[4])(PVar4.m_p);
              if (((char)iVar7 == '\0') &&
                 (((testCase->super_TestCaseInfo).properties & Throws) != None)) goto LAB_0012c942;
              RunContext::runTest((Totals *)local_2f8,&local_248,testCase);
              local_308._0_8_ = local_2f8._0_8_ + local_308._0_8_;
              local_308._8_8_ = local_308._8_8_ + local_2f8._8_8_;
              (local_358->assertions).passed = local_308._0_8_;
              (local_358->assertions).failed = local_308._8_8_;
              local_318._0_8_ = local_318._0_8_ + local_2f8._16_8_;
              local_318._8_8_ = local_318._8_8_ + local_2f8._24_8_;
              (local_358->assertions).failedButOk = local_318._0_8_;
              (local_358->testCases).passed = local_318._8_8_;
              local_328._0_8_ = local_328._0_8_ + local_2d8;
              local_328._8_8_ =
                   local_328._8_8_ +
                   CONCAT71(aStack_2d0._M_allocated_capacity._1_7_,aStack_2d0._M_local_buf[0]);
              (local_358->testCases).failed = local_328._0_8_;
              (local_358->testCases).failedButOk = local_328._8_8_;
              goto LAB_0012c952;
            }
            iVar7 = (*(pPVar10->m_p->super_SharedImpl<Catch::IShared>).super_IShared.
                      super_NonCopyable._vptr_NonCopyable[4])(pPVar10->m_p,testCase);
            if ((char)iVar7 == '\0') break;
            pPVar10 = pPVar10 + 1;
          }
        }
      }
LAB_0012c942:
      (*((local_368.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])
                (local_368.m_p,testCase);
LAB_0012c952:
      testCase = testCase + 1;
    } while (testCase != local_330);
  }
  (*(((SharedImpl<Catch::IConfig> *)&(local_360.m_p)->super_IShared)->super_IConfig).super_IShared.
    super_NonCopyable._vptr_NonCopyable[6])(local_2f8);
  RunContext::testGroupEnded(&local_248,(string *)local_2f8,local_358,1,1);
  if ((undefined1 *)local_2f8._0_8_ != local_2f8 + 0x10) {
    operator_delete((void *)local_2f8._0_8_);
  }
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&local_348);
  RunContext::~RunContext(&local_248);
  if (local_368.m_p != (IStreamingReporter *)0x0) {
    (*((local_368.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
  }
  if ((Config *)local_360.m_p != (Config *)0x0) {
    (*(((SharedImpl<Catch::IConfig> *)&(local_360.m_p)->super_IShared)->super_IConfig).super_IShared
      .super_NonCopyable._vptr_NonCopyable[3])();
  }
  return local_358;
}

Assistant:

Totals runTests( Ptr<Config> const& config ) {

        Ptr<IConfig const> iconfig = config.get();

        Ptr<IStreamingReporter> reporter = makeReporter( config );
        reporter = addListeners( iconfig, reporter );

        RunContext context( iconfig, reporter );

        Totals totals;

        context.testGroupStarting( config->name(), 1, 1 );

        TestSpec testSpec = config->testSpec();
        if( !testSpec.hasFilters() )
            testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "~[.]" ).testSpec(); // All not hidden tests

        std::vector<TestCase> const& allTestCases = getAllTestCasesSorted( *iconfig );
        for( std::vector<TestCase>::const_iterator it = allTestCases.begin(), itEnd = allTestCases.end();
                it != itEnd;
                ++it ) {
            if( !context.aborting() && matchTest( *it, testSpec, *iconfig ) )
                totals += context.runTest( *it );
            else
                reporter->skipTest( *it );
        }

        context.testGroupEnded( iconfig->name(), totals, 1, 1 );
        return totals;
    }